

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtaudio_c.cpp
# Opt level: O0

rtaudio_api_t rtaudio_compiled_api_by_name(char *name)

{
  allocator local_39;
  string local_38 [36];
  Api local_14;
  char *pcStack_10;
  Api api;
  char *name_local;
  
  local_14 = UNSPECIFIED;
  if (name != (char *)0x0) {
    pcStack_10 = name;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_38,name,&local_39);
    local_14 = RtAudio::getCompiledApiByName((string *)local_38);
    std::__cxx11::string::~string(local_38);
    std::allocator<char>::~allocator((allocator<char> *)&local_39);
  }
  return local_14;
}

Assistant:

rtaudio_api_t rtaudio_compiled_api_by_name(const char *name) {
  RtAudio::Api api = RtAudio::UNSPECIFIED;
  if (name) {
    api = RtAudio::getCompiledApiByName(name);
  }
  return (rtaudio_api_t)api;
}